

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O0

void __thiscall Wasm::WasmBinaryReader::ReadImportSection(WasmBinaryReader *this)

{
  WebAssemblyModule *this_00;
  WasmNode init;
  WasmType type_00;
  bool bVar1;
  uint uVar2;
  uint32 uVar3;
  uint sourceContextId;
  LocalFunctionId functionId;
  uint32 uVar4;
  FunctionBody *pFVar5;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined1 local_45;
  WasmType local_44;
  uint uStack_40;
  bool isMutable;
  WasmType type;
  uint32 sigId;
  ExternalKinds kind;
  char16 *fnName;
  char16 *modName;
  uint32 local_20;
  uint32 fnNameLen;
  uint32 modNameLen;
  uint32 i;
  uint32 numImports;
  uint32 len;
  WasmBinaryReader *this_local;
  
  i = 0;
  _numImports = this;
  uVar2 = LEB128<unsigned_int,32u>(this,&i);
  modNameLen = uVar2;
  uVar3 = Limits::GetMaxImports();
  if (uVar3 < uVar2) {
    ThrowDecodingError(this,L"Too many imports");
  }
  fnNameLen = 0;
  do {
    if (modNameLen <= fnNameLen) {
      return;
    }
    local_20 = 0;
    modName._4_4_ = 0;
    fnName = ReadInlineName(this,&i,&local_20);
    _sigId = ReadInlineName(this,&i,(uint32 *)((long)&modName + 4));
    type._3_1_ = ReadExternalKind(this);
    pFVar5 = GetFunctionBody(this);
    if (pFVar5 == (FunctionBody *)0x0) {
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,WasmReaderPhase);
      if (bVar1) goto LAB_0160a5fc;
    }
    else {
      pFVar5 = GetFunctionBody(this);
      sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar5);
      pFVar5 = GetFunctionBody(this);
      functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar5);
      bVar1 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_01ec1678,WasmReaderPhase,sourceContextId,functionId);
      if (bVar1) {
LAB_0160a5fc:
        Output::Print(L"Import #%u: \"%s\".\"%s\", kind: %d",(ulong)fnNameLen,fnName,_sigId,
                      (ulong)(byte)type._3_1_);
        Output::Print(L"\n");
        Output::Flush();
      }
    }
    switch(type._3_1_) {
    case 0:
      uStack_40 = LEB128<unsigned_int,32u>(this,&i);
      Js::WebAssemblyModule::AddFunctionImport
                (this->m_module,uStack_40,fnName,local_20,_sigId,modName._4_4_);
      uVar3 = Js::WebAssemblyModule::GetWasmFunctionCount(this->m_module);
      uVar4 = Limits::GetMaxFunctions();
      if (uVar4 < uVar3) {
        ThrowDecodingError(this,L"Too many functions");
      }
      break;
    case 1:
      ReadTableSection(this,true);
      Js::WebAssemblyModule::AddTableImport(this->m_module,fnName,local_20,_sigId,modName._4_4_);
      break;
    case 2:
      ReadMemorySection(this,true);
      Js::WebAssemblyModule::AddMemoryImport(this->m_module,fnName,local_20,_sigId,modName._4_4_);
      break;
    case 3:
      local_44 = ReadWasmType(this,&i);
      bVar1 = ReadMutableValue(this);
      type_00 = local_44;
      local_45 = bVar1;
      if (bVar1) {
        ThrowDecodingError(this,L"Mutable globals cannot be imported");
      }
      this_00 = this->m_module;
      memset(&local_68,0,0x20);
      init.field_1._0_1_ = (bool)(undefined1)local_60;
      init.field_1._1_3_ = local_60._1_3_;
      init.field_1._4_4_ = (anon_union_4_2_52a1cc71_for_WasmBlock_1)local_60._4_4_;
      init._0_8_ = local_68;
      init.field_1.brTable.targetTable = (uint32 *)local_58;
      init.field_1._16_8_ = local_50;
      Js::WebAssemblyModule::AddGlobal(this_00,ImportedReference,type_00,bVar1,init);
      Js::WebAssemblyModule::AddGlobalImport(this->m_module,fnName,local_20,_sigId,modName._4_4_);
      uVar3 = Js::WebAssemblyModule::GetGlobalCount(this->m_module);
      uVar4 = Limits::GetMaxGlobals();
      if (uVar4 < uVar3) {
        ThrowDecodingError(this,L"Too many globals");
      }
      break;
    default:
      ThrowDecodingError(this,L"Imported Kind %d, NYI",(ulong)(byte)type._3_1_);
    }
    fnNameLen = fnNameLen + 1;
  } while( true );
}

Assistant:

void WasmBinaryReader::ReadImportSection()
{
    uint32 len = 0;
    uint32 numImports = LEB128(len);

    if (numImports > Limits::GetMaxImports())
    {
        ThrowDecodingError(_u("Too many imports"));
    }

    for (uint32 i = 0; i < numImports; ++i)
    {
        uint32 modNameLen = 0, fnNameLen = 0;
        const char16* modName = ReadInlineName(len, modNameLen);
        const char16* fnName = ReadInlineName(len, fnNameLen);

        ExternalKinds kind = ReadExternalKind();
        TRACE_WASM_DECODER(_u("Import #%u: \"%s\".\"%s\", kind: %d"), i, modName, fnName, kind);
        switch (kind)
        {
        case ExternalKinds::Function:
        {
            uint32 sigId = LEB128(len);
            m_module->AddFunctionImport(sigId, modName, modNameLen, fnName, fnNameLen);
            if (m_module->GetWasmFunctionCount() > Limits::GetMaxFunctions())
            {
                ThrowDecodingError(_u("Too many functions"));
            }
            break;
        }
        case ExternalKinds::Global:
        {
            WasmTypes::WasmType type = ReadWasmType(len);
            bool isMutable = ReadMutableValue();
            if (isMutable)
            {
                ThrowDecodingError(_u("Mutable globals cannot be imported"));
            }
            m_module->AddGlobal(GlobalReferenceTypes::ImportedReference, type, isMutable, {});
            m_module->AddGlobalImport(modName, modNameLen, fnName, fnNameLen);
            if (m_module->GetGlobalCount() > Limits::GetMaxGlobals())
            {
                ThrowDecodingError(_u("Too many globals"));
            }
            break;
        }
        case ExternalKinds::Table:
            ReadTableSection(true);
            m_module->AddTableImport(modName, modNameLen, fnName, fnNameLen);
            break;
        case ExternalKinds::Memory:
            ReadMemorySection(true);
            m_module->AddMemoryImport(modName, modNameLen, fnName, fnNameLen);

            break;
        default:
            ThrowDecodingError(_u("Imported Kind %d, NYI"), kind);
            break;
        }
    }
}